

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::Data
          (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *this,
          Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ProFile *pPVar4;
  Node<ProKey,_ProFunctionDef> *this_00;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  R RVar8;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar6 = other->numBuckets;
  sVar7 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar7;
  this->spans = (Span *)0x0;
  RVar8 = allocateSpans(sVar6);
  this->spans = (Span *)RVar8.spans;
  if (RVar8.nSpans != 0) {
    lVar5 = 0;
    sVar6 = 0;
    do {
      pSVar2 = other->spans;
      sVar7 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar7 + lVar5];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar6].entries;
          this_00 = Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::insert
                              (this->spans + sVar6,sVar7);
          ProString::ProString((ProString *)this_00,(ProString *)(pEVar3 + bVar1));
          pPVar4 = *(ProFile **)(pEVar3[bVar1].storage.data + 0x30);
          (this_00->value).m_pro = pPVar4;
          (this_00->value).m_offset = *(int *)(pEVar3[bVar1].storage.data + 0x38);
          (pPVar4->m_refCount).m_cnt = (pPVar4->m_refCount).m_cnt + 1;
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != 0x80);
      sVar6 = sVar6 + 1;
      lVar5 = lVar5 + 0x90;
    } while (sVar6 != RVar8.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }